

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O1

Result * validateOtherTopLevelUpdateParameters
                   (Result *__return_storage_ptr__,NetworkUpdateParameters *updateParameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Int64Parameter *pIVar4;
  Result r;
  string err;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  string local_78;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  CoreML::Result::Result((Result *)local_c0);
  paVar2 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar2;
  if ((updateParameters ==
       (NetworkUpdateParameters *)&CoreML::Specification::_NetworkUpdateParameters_default_instance_
      ) || (updateParameters->epochs_ == (Int64Parameter *)0x0)) {
    std::__cxx11::string::_M_replace((ulong)&local_78,0,(char *)0x0,0x6283ec);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_78);
  }
  else {
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"epochs","");
    pIVar4 = updateParameters->epochs_;
    if (pIVar4 == (Int64Parameter *)0x0) {
      pIVar4 = (Int64Parameter *)&CoreML::Specification::_Int64Parameter_default_instance_;
    }
    CoreML::validateInt64Parameter((Result *)local_58,&local_98,pIVar4,true);
    local_c0 = local_58;
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    bVar3 = CoreML::Result::good((Result *)local_c0);
    if ((bVar3) && (updateParameters->seed_ != (Int64Parameter *)0x0)) {
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"seed","");
      pIVar4 = updateParameters->seed_;
      if (pIVar4 == (Int64Parameter *)0x0) {
        pIVar4 = (Int64Parameter *)&CoreML::Specification::_Int64Parameter_default_instance_;
      }
      CoreML::validateInt64Parameter((Result *)local_58,&local_98,pIVar4,false);
      local_c0 = local_58;
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      CoreML::Result::good((Result *)local_c0);
    }
    __return_storage_ptr__->m_type = local_c0._0_4_;
    __return_storage_ptr__->m_reason = local_c0._4_4_;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p == &local_a8) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_a8._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_b8._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_b0;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_b8._M_p = (pointer)&local_a8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,
                    CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Result validateOtherTopLevelUpdateParameters(const Specification::NetworkUpdateParameters& updateParameters) {
    Result r;
    std::string err;
    
    if (false == updateParameters.has_epochs()) {
        err = "Epochs should be included in neural network update parameters.";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }
    
    r = validateInt64Parameter("epochs", updateParameters.epochs(), true);
    if (!r.good()) {return r;}

    if (updateParameters.has_seed()) {
        r = validateInt64Parameter("seed", updateParameters.seed(), false);
        if (!r.good()) {return r;}
    }

    return r;
}